

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

bool __thiscall
chaiscript::Type_Conversions::convertable_type<chaiscript::Boxed_Number_const&>
          (Type_Conversions *this)

{
  const_iterator cVar1;
  type_info *type;
  key_type local_18;
  
  local_18 = (key_type)&Boxed_Number::typeinfo;
  if ((this->m_thread_cache).obj._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this->m_num_types).super___atomic_base<unsigned_long>._M_i) {
    std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::operator=((_Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                 *)&this->m_thread_cache,&(this->m_convertableTypes)._M_t);
  }
  cVar1 = std::
          _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::find((_Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                  *)&this->m_thread_cache,&local_18);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->m_thread_cache).obj._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool convertable_type() const noexcept {
      const auto type = user_type<T>().bare_type_info();
      return thread_cache().count(type) != 0;
    }